

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

statement_ptr __thiscall mjs::parser::make_statement<mjs::debugger_statement>(parser *this)

{
  long *plVar1;
  pointer pwVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  size_type sVar4;
  long in_RSI;
  
  plVar1 = *(long **)(in_RSI + 0x70);
  if (plVar1 != (long *)0x0) {
    peVar3 = (element_type *)operator_new(0x20);
    pwVar2 = *(pointer *)*plVar1;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((undefined8 *)*plVar1)[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    sVar4 = CONCAT44(*(undefined4 *)(*plVar1 + 100),(int)plVar1[3]);
    *(undefined ***)peVar3 = &PTR__syntax_node_001db120;
    (peVar3->filename_)._M_dataplus._M_p = pwVar2;
    (peVar3->filename_)._M_string_length = (size_type)this_00;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (peVar3->filename_).field_2._M_allocated_capacity = sVar4;
      *(undefined ***)peVar3 = &PTR__syntax_node_001db900;
      (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar3;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      (peVar3->filename_).field_2._M_allocated_capacity = sVar4;
      *(undefined ***)peVar3 = &PTR__syntax_node_001db900;
      (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
           (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
  }
  __assert_fail("statement_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x147,
                "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::debugger_statement, Args = <>]"
               );
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }